

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void variance_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x1a4,"void variance_double_suite::test_exponential_increase()",local_38,&local_40);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_40 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a5,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  builtin_strncpy(local_38,"333333\x17@",8);
  local_40 = 5.8;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a7,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = ')';
  local_38[1] = '\\';
  local_38[2] = -0x71;
  local_38[3] = -0x3e;
  local_38[4] = -0xb;
  local_38[5] = '(';
  local_38[6] = '$';
  local_38[7] = '@';
  local_40 = 10.08;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","10.08","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a8,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = -0x23;
  local_38[1] = -0x42;
  local_38[2] = -0x4e;
  local_38[3] = 'z';
  local_38[4] = -0x69;
  local_38[5] = -0x44;
  local_38[6] = 'D';
  local_38[7] = '@';
  local_40 = 41.4734;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.4734","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1aa,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = -0x58;
  local_38[1] = 'w';
  local_38[2] = '6';
  local_38[3] = -0x7a;
  local_38[4] = -0x29;
  local_38[5] = ';';
  local_38[6] = -0x69;
  local_38[7] = '@';
  local_40 = 1486.96;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1486.96","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ab,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = -0x48;
  local_38[1] = '\x02';
  local_38[2] = 'R';
  local_38[3] = '\x7f';
  local_38[4] = '+';
  local_38[5] = -0x50;
  local_38[6] = 't';
  local_38[7] = '@';
  local_40 = 331.01;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ad,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = ')';
  local_38[1] = '\r';
  local_38[2] = -0x6e;
  local_38[3] = 'M';
  local_38[4] = 'K';
  local_38[5] = '\x18';
  local_38[6] = '\x04';
  local_38[7] = 'A';
  local_40 = 164617.0;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","164617.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ae,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = -0x1e;
  local_38[1] = -0x65;
  local_38[2] = '1';
  local_38[3] = -0x1d;
  local_38[4] = -0x5d;
  local_38[5] = -8;
  local_38[6] = -0x5b;
  local_38[7] = '@';
  local_40 = 2812.32;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b0,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = 'Y';
  local_38[1] = '3';
  local_38[2] = -0x6e;
  local_38[3] = -0x35;
  local_38[4] = '[';
  local_38[5] = 'A';
  local_38[6] = 'p';
  local_38[7] = 'A';
  local_40 = 17044900.0;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.70449e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b1,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = 'm';
  local_38[1] = -0x44;
  local_38[2] = -0x1f;
  local_38[3] = -0x1b;
  local_38[4] = '\t';
  local_38[5] = 'E';
  local_38[6] = -0x28;
  local_38[7] = '@';
  local_40 = 24852.2;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b3,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  local_38[0] = -0x2c;
  local_38[1] = '\x1b';
  local_38[2] = '\v';
  local_38[3] = -0x3c;
  local_38[4] = -0x1e;
  local_38[5] = -0x3c;
  local_38[6] = -0x27;
  local_38[7] = 'A';
  local_40 = 1729330000.0;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.72933e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b4,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_09);
  local_38[0] = -0x31;
  local_38[1] = 'Z';
  local_38[2] = -0x6a;
  local_38[3] = -0x54;
  local_38[4] = -0x1c;
  local_38[5] = -0x78;
  local_38[6] = '\v';
  local_38[7] = 'A';
  local_40 = 225565.0;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b6,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_10);
  local_38[0] = -0x75;
  local_38[1] = -0x4a;
  local_38[2] = -0x44;
  local_38[3] = -0xe;
  local_38[4] = -0x7e;
  local_38[5] = 'I';
  local_38[6] = 'D';
  local_38[7] = 'B';
  local_40 = 174265000000.0;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.74265e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b7,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_11);
  local_38[0] = -0x7a;
  local_38[1] = -0x35;
  local_38[2] = '\x0f';
  local_38[3] = -0x5e;
  local_38[4] = '1';
  local_38[5] = -0x28;
  local_38[6] = '?';
  local_38[7] = 'A';
  local_40 = 2086960.0;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b9,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_12);
  local_38[0] = 'A';
  local_38[1] = '%';
  local_38[2] = '\r';
  local_38[3] = -0x55;
  local_38[4] = '\v';
  local_38[5] = -0x21;
  local_38[6] = -0x51;
  local_38[7] = 'B';
  local_40 = 17521400000000.0;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.75214e13","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ba,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_13);
  local_38[0] = -0x35;
  local_38[1] = -0x1f;
  local_38[2] = -0x5d;
  local_38[3] = 'j';
  local_38[4] = '2';
  local_38[5] = -0x52;
  local_38[6] = 'r';
  local_38[7] = 'A';
  local_40 = 19587900.0;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bc,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_14);
  local_38[0] = -0x3f;
  local_38[1] = -0x5d;
  local_38[2] = -0x18;
  local_38[3] = '\n';
  local_38[4] = -0x2f;
  local_38[5] = '\x04';
  local_38[6] = '\x19';
  local_38[7] = 'C';
  local_40 = 1.76054e+15;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76054e15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bd,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_15);
  local_38[0] = 'R';
  local_38[1] = 'G';
  local_38[2] = '|';
  local_38[3] = 'z';
  local_38[4] = -0x1d;
  local_38[5] = '(';
  local_38[6] = -0x5a;
  local_38[7] = 'A';
  local_40 = 185889000.0;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bf,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_16);
  local_38[0] = -0x6f;
  local_38[1] = 'Y';
  local_38[2] = '\x17';
  local_38[3] = 'A';
  local_38[4] = '\x1d';
  local_38[5] = -0x5d;
  local_38[6] = -0x7d;
  local_38[7] = 'C';
  local_40 = 1.76876e+17;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76876e17","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1c0,0x10e6ab,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_17);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-4);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 10.08, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.4734, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1486.96, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 164617., tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.70449e7, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.72933e9, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.74265e11, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.75214e13, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76054e15, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76876e17, tolerance);
}